

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool string_raw(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  byte bVar1;
  gravity_object_t *pgVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar6;
  double dVar7;
  gravity_value_t value;
  
  pgVar2 = (args->field_1).p;
  aVar6.n = 0;
  uVar3 = utf8_charbytes((char *)pgVar2->objclass,0);
  if (uVar3 != 0) {
    uVar5 = (ulong)uVar3;
    uVar4 = 0;
    do {
      uVar3 = uVar3 - 1;
      bVar1 = *(byte *)((long)&pgVar2->objclass->isa + uVar4);
      uVar4 = uVar4 + 1;
      dVar7 = pow(10.0,(double)uVar3);
      aVar6.n._0_4_ = (int)aVar6.n + (int)(long)(dVar7 * (double)bVar1);
      aVar6.n._4_4_ = 0;
    } while (uVar4 != uVar5);
    aVar6.n._4_4_ = 0;
  }
  value.field_1.n = aVar6.n;
  value.isa = gravity_class_int;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool string_raw (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));
    
    uint32_t ascii = 0;
    uint32_t n = utf8_charbytes(string->s, 0);
    for (uint32_t i=0; i<n; ++i) {
        // if (n > 1) {printf("%u (%d)\n", (uint8_t)string->s[i], (uint32_t)pow(10, n-(i+1)));}
		ascii += (uint32_t)((uint8_t)string->s[i] * pow(10, n - (i + 1)));
    }
    
    RETURN_VALUE(VALUE_FROM_INT(ascii), rindex);
}